

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::expandGrid<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,vector<int,_std::allocator<int>_> *point,
          vector<double,_std::allocator<double>_> *value)

{
  MultiIndexSet *old_set;
  vector<int,_std::allocator<int>_> *this_00;
  size_t *psVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer piVar4;
  vector<double,_std::allocator<double>_> *__x;
  int iVar5;
  int *g;
  pointer piVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int *g_1;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> xnode;
  vector<int,_std::allocator<int>_> levels;
  vector<int,_std::allocator<int>_> graph;
  vector<double,_std::allocator<double>_> surp;
  vector<double,_std::allocator<double>_> approximation;
  allocator_type local_d9;
  vector<double,_std::allocator<double>_> local_d8;
  MultiIndexSet local_c0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> *local_38;
  
  old_set = &(this->super_BaseCanonicalGrid).points;
  this_00 = &(this->super_BaseCanonicalGrid).points.indexes;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar13 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
    local_38 = (vector<double,_std::allocator<double>_> *)value;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_d8,
               (vector<int,_std::allocator<int>_> *)point);
    local_c0.cache_num_indexes =
         (int)((ulong)((long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) / uVar13);
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    old_set->num_dimensions = uVar13;
    (this->super_BaseCanonicalGrid).points.cache_num_indexes = local_c0.cache_num_indexes;
    local_c0.num_dimensions = uVar13;
    ::std::vector<int,_std::allocator<int>_>::operator=(this_00,&local_c0.indexes);
    if ((pointer)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    __x = local_38;
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    sVar14 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_d8,__x);
    local_c0.cache_num_indexes = 1;
    local_c0._12_4_ = 0;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this->super_BaseCanonicalGrid).values.num_outputs = sVar14;
    (this->super_BaseCanonicalGrid).values.num_values = 1;
    local_c0.num_dimensions = sVar14;
    ::std::vector<double,_std::allocator<double>_>::operator=
              (&(this->super_BaseCanonicalGrid).values.values,
               (vector<double,_std::allocator<double>_> *)&local_c0.indexes);
    if ((pointer)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    sVar14 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_d8,__x);
    local_c0.cache_num_indexes = 1;
    local_c0._12_4_ = 0;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this->surpluses).stride = sVar14;
    (this->surpluses).num_strips = 1;
    local_c0.num_dimensions = sVar14;
    ::std::vector<double,_std::allocator<double>_>::operator=
              (&(this->surpluses).vec,(vector<double,_std::allocator<double>_> *)&local_c0.indexes);
    local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  }
  else {
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,(long)(this->super_BaseCanonicalGrid).num_dimensions,
               (allocator_type *)&local_c0);
    if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
      lVar12 = 0;
      do {
        dVar15 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                           ((point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar12]);
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar12] = dVar15;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (this->super_BaseCanonicalGrid).num_dimensions);
    }
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_50,(long)(this->super_BaseCanonicalGrid).num_outputs,
               (allocator_type *)&local_c0);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_68,(long)(this->super_BaseCanonicalGrid).num_outputs,
               (allocator_type *)&local_c0);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x10])
              (this,local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
               local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pdVar3 = (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        pdVar2 = (double *)
                 ((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar12);
        *(double *)
         ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar12) =
             *(double *)((long)pdVar3 + lVar12) - *pdVar2;
        lVar12 = lVar12 + 8;
      } while (pdVar2 + 1 !=
               local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    getSubGraph<(TasGrid::RuleLocal::erule)2>(&local_80,this,point);
    uVar13 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_98,(vector<int,_std::allocator<int>_> *)point);
    local_c0.cache_num_indexes =
         (int)((ulong)((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) / uVar13);
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_c0.num_dimensions = uVar13;
    StorageSet::addValues
              (&(this->super_BaseCanonicalGrid).values,old_set,&local_c0,
               (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    if ((double *)
        local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (double *)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    MultiIndexSet::addSortedIndexes(old_set,(vector<int,_std::allocator<int>_> *)point);
    iVar5 = MultiIndexSet::getSlot
                      (old_set,(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start);
    ::std::vector<double,std::allocator<double>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              ((vector<double,std::allocator<double>> *)&(this->surpluses).vec,
               (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (long)iVar5 * (this->surpluses).stride,
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    psVar1 = &(this->surpluses).num_strips;
    *psVar1 = *psVar1 + 1;
    for (piVar6 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      if (iVar5 <= *piVar6) {
        *piVar6 = *piVar6 + 1;
      }
    }
    local_c0.num_dimensions = local_c0.num_dimensions & 0xffffffff00000000;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_98,(long)(this->super_BaseCanonicalGrid).points.cache_num_indexes,
               (value_type_conflict3 *)&local_c0,&local_d9);
    for (piVar6 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      lVar12 = old_set->num_dimensions * (long)*piVar6;
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = piVar4[lVar12];
      uVar7 = uVar10;
      if ((1 < uVar10) && (uVar7 = 1, uVar10 != 2)) {
        uVar10 = uVar10 - 1;
        do {
          uVar10 = (int)uVar10 >> 1;
          uVar7 = uVar7 + 1;
        } while (1 < uVar10);
      }
      lVar8 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
      if (1 < lVar8) {
        lVar9 = 1;
        do {
          uVar10 = piVar4[lVar12 + lVar9];
          uVar11 = uVar10;
          if ((1 < uVar10) && (uVar11 = 1, uVar10 != 2)) {
            uVar10 = uVar10 - 1;
            do {
              uVar10 = (int)uVar10 >> 1;
              uVar11 = uVar11 + 1;
            } while (1 < uVar10);
          }
          uVar7 = uVar7 + uVar11;
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar8);
      }
      *(uint *)((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)*piVar6 * 4) = uVar7;
      lVar12 = (long)(this->super_BaseCanonicalGrid).num_outputs;
      if (0 < lVar12) {
        memmove((this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (this->surpluses).stride * (long)*piVar6,
                (this->super_BaseCanonicalGrid).values.values.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start + (long)*piVar6 * (this->super_BaseCanonicalGrid).values.num_outputs,
                lVar12 << 3);
      }
    }
    iVar5 = this->top_level;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>
              ((Data2D<int> *)&local_c0,old_set);
    updateSurpluses<(TasGrid::RuleLocal::erule)2>
              (this,old_set,iVar5 + 1,(vector<int,_std::allocator<int>_> *)&local_98,
               (Data2D<int> *)&local_c0);
    if ((double *)
        local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (double *)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  buildTree(this);
  return;
}

Assistant:

void GridLocalPolynomial::expandGrid(const std::vector<int> &point, const std::vector<double> &value){
    if (points.empty()){ // only one point
        points = MultiIndexSet((size_t) num_dimensions, std::vector<int>(point));
        values = StorageSet(num_outputs, 1, std::vector<double>(value));
        surpluses = Data2D<double>(num_outputs, 1, std::vector<double>(value)); // one value is its own surplus
    }else{ // merge with existing points
        // compute the surplus for the point
        std::vector<double> xnode(num_dimensions);
        for(int j=0; j<num_dimensions; j++)
            xnode[j] = RuleLocal::getNode<effrule>(point[j]);

        std::vector<double> approximation(num_outputs), surp(num_outputs);
        evaluate(xnode.data(), approximation.data());
        std::transform(approximation.begin(), approximation.end(), value.begin(), surp.begin(), [&](double e, double v)->double{ return v - e; });

        std::vector<int> graph = getSubGraph<effrule>(point); // get the descendant nodes that must be updated later

        values.addValues(points, MultiIndexSet(num_dimensions, std::vector<int>(point)), value.data()); // added the value

        points.addSortedIndexes(point); // add the point
        int newindex = points.getSlot(point);
        surpluses.appendStrip(newindex, surp); // find the index of the new point

        for(auto &g : graph) if (g >= newindex) g++; // all points belowe the newindex have been shifted down by one spot

        std::vector<int> levels(points.getNumIndexes(), 0); // compute the levels, but only for the new indexes
        for(auto &g : graph){
            int const *pnt = points.getIndex(g);
            int l = RuleLocal::getLevel<effrule>(pnt[0]);
            for(int j=1; j<num_dimensions; j++) l += RuleLocal::getLevel<effrule>(pnt[j]);
            levels[g] = l;

            std::copy_n(values.getValues(g), num_outputs, surpluses.getStrip(g)); // reset the surpluses to the values (will be updated)
        }

        // compute the current DAG and update the surplused for the descendants
        updateSurpluses<effrule>(points, top_level + 1, levels, HierarchyManipulations::computeDAGup<effrule>(points));
    }
    buildTree(); // the tree is needed for evaluate(), must be rebuild every time the points set is updated
}